

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

unique_ptr<Catch::Detail::EnumInfo>
Catch::Detail::makeEnumInfo
          (StringRef enumName,StringRef allValueNames,vector<int,_std::allocator<int>_> *values)

{
  bool bVar1;
  EnumInfo *pEVar2;
  size_type in_RDX;
  char *in_RSI;
  EnumInfo *in_RDI;
  vector<int,_std::allocator<int>_> *in_R9;
  StringRef in_stack_00000010;
  int value;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t i;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> valueNames;
  unique_ptr<Catch::Detail::EnumInfo> *enumInfo;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  StringRef *in_stack_ffffffffffffff40;
  EnumInfo *this;
  size_type in_stack_ffffffffffffff68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff70;
  size_type local_80;
  vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> local_60;
  byte local_31;
  vector<int,_std::allocator<int>_> *local_30;
  char *local_18;
  size_type sStack_10;
  
  local_31 = 0;
  this = in_RDI;
  local_30 = in_R9;
  local_18 = in_RSI;
  sStack_10 = in_RDX;
  make_unique<Catch::Detail::EnumInfo>();
  pEVar2 = unique_ptr<Catch::Detail::EnumInfo>::operator->
                     ((unique_ptr<Catch::Detail::EnumInfo> *)this);
  (pEVar2->m_name).m_start = local_18;
  (pEVar2->m_name).m_size = sStack_10;
  unique_ptr<Catch::Detail::EnumInfo>::operator->((unique_ptr<Catch::Detail::EnumInfo> *)this);
  std::vector<int,_std::allocator<int>_>::size(local_30);
  std::vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
  ::reserve((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
             *)in_stack_ffffffffffffff70._M_current,in_stack_ffffffffffffff68);
  parseEnums(in_stack_00000010);
  local_80 = 0;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff40,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff70);
    pEVar2 = unique_ptr<Catch::Detail::EnumInfo>::operator->
                       ((unique_ptr<Catch::Detail::EnumInfo> *)this);
    in_stack_ffffffffffffff40 = (StringRef *)&pEVar2->m_values;
    std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::operator[](&local_60,local_80)
    ;
    std::vector<std::pair<int,Catch::StringRef>,std::allocator<std::pair<int,Catch::StringRef>>>::
    emplace_back<int&,Catch::StringRef_const&>
              ((vector<std::pair<int,_Catch::StringRef>,_std::allocator<std::pair<int,_Catch::StringRef>_>_>
                *)this,(int *)in_RDI,in_stack_ffffffffffffff40);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffff70);
    local_80 = local_80 + 1;
  }
  local_31 = 1;
  std::vector<Catch::StringRef,_std::allocator<Catch::StringRef>_>::~vector
            ((vector<Catch::StringRef,_std::allocator<Catch::StringRef>_> *)this);
  if ((local_31 & 1) == 0) {
    unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr
              ((unique_ptr<Catch::Detail::EnumInfo> *)in_stack_ffffffffffffff40);
  }
  return (unique_ptr<Catch::Detail::EnumInfo>)in_RDI;
}

Assistant:

Catch::Detail::unique_ptr<EnumInfo> makeEnumInfo( StringRef enumName, StringRef allValueNames, std::vector<int> const& values ) {
            auto enumInfo = Catch::Detail::make_unique<EnumInfo>();
            enumInfo->m_name = enumName;
            enumInfo->m_values.reserve( values.size() );

            const auto valueNames = Catch::Detail::parseEnums( allValueNames );
            assert( valueNames.size() == values.size() );
            std::size_t i = 0;
            for( auto value : values )
                enumInfo->m_values.emplace_back(value, valueNames[i++]);

            return enumInfo;
        }